

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretOptions
          (OptionInterpreter *this,OptionsToInterpret *options_to_interpret)

{
  DescriptorBuilder *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Descriptor *pDVar5;
  FieldDescriptor *pFVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Message *pMVar7;
  UninterpretedOption *pUVar8;
  LogMessage *pLVar9;
  string *element_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  LogFinisher local_1c2;
  byte local_1c1;
  LogMessage local_1c0;
  LogFinisher local_182;
  byte local_181;
  LogMessage local_180;
  undefined1 local_148 [8];
  string buf;
  int i;
  int num_uninterpreted_options;
  allocator local_d9;
  string local_d8;
  FieldDescriptor *local_b8;
  FieldDescriptor *original_uninterpreted_options_field;
  LogMessage local_a8;
  allocator local_59;
  string local_58;
  FieldDescriptor *local_38;
  FieldDescriptor *uninterpreted_options_field;
  Message *pMStack_28;
  bool failed;
  Message *original_options;
  Message *options;
  OptionsToInterpret *options_to_interpret_local;
  OptionInterpreter *this_local;
  
  original_options = options_to_interpret->options;
  pMStack_28 = options_to_interpret->original_options;
  uninterpreted_options_field._7_1_ = 0;
  this->options_to_interpret_ = options_to_interpret;
  options = (Message *)options_to_interpret;
  options_to_interpret_local = (OptionsToInterpret *)this;
  pDVar5 = Message::GetDescriptor(original_options);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"uninterpreted_option",&local_59);
  pFVar6 = Descriptor::FindFieldByName(pDVar5,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  original_uninterpreted_options_field._7_1_ = 0;
  local_38 = pFVar6;
  if (pFVar6 == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1740);
    original_uninterpreted_options_field._7_1_ = 1;
    pLVar9 = internal::LogMessage::operator<<
                       (&local_a8,"CHECK failed: uninterpreted_options_field != NULL: ");
    pLVar9 = internal::LogMessage::operator<<
                       (pLVar9,"No field named \"uninterpreted_option\" in the Options proto.");
    internal::LogFinisher::operator=
              ((LogFinisher *)((long)&original_uninterpreted_options_field + 6),pLVar9);
  }
  if ((original_uninterpreted_options_field._7_1_ & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a8);
  }
  iVar2 = (*(original_options->super_MessageLite)._vptr_MessageLite[0x16])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar2),original_options,local_38);
  pDVar5 = Message::GetDescriptor(pMStack_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"uninterpreted_option",&local_d9);
  pFVar6 = Descriptor::FindFieldByName(pDVar5,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  i._3_1_ = 0;
  local_b8 = pFVar6;
  if (pFVar6 == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&num_uninterpreted_options,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1748);
    i._3_1_ = 1;
    pLVar9 = internal::LogMessage::operator<<
                       ((LogMessage *)&num_uninterpreted_options,
                        "CHECK failed: original_uninterpreted_options_field != NULL: ");
    pLVar9 = internal::LogMessage::operator<<
                       (pLVar9,"No field named \"uninterpreted_option\" in the Options proto.");
    internal::LogFinisher::operator=((LogFinisher *)((long)&i + 2),pLVar9);
  }
  if ((i._3_1_ & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)&num_uninterpreted_options);
  }
  iVar2 = (*(pMStack_28->super_MessageLite)._vptr_MessageLite[0x16])();
  iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x30))
                    ((long *)CONCAT44(extraout_var_00,iVar2),pMStack_28,local_b8);
  buf.field_2._12_4_ = 0;
  do {
    if (iVar2 <= (int)buf.field_2._12_4_) {
LAB_00a83a09:
      this->uninterpreted_option_ = (UninterpretedOption *)0x0;
      this->options_to_interpret_ = (OptionsToInterpret *)0x0;
      if ((uninterpreted_options_field._7_1_ & 1) == 0) {
        std::__cxx11::string::string((string *)local_148);
        local_181 = 0;
        bVar1 = MessageLite::AppendPartialToString
                          (&original_options->super_MessageLite,(string *)local_148);
        if (!bVar1) {
          internal::LogMessage::LogMessage
                    (&local_180,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1765);
          local_181 = 1;
          pLVar9 = internal::LogMessage::operator<<
                             (&local_180,"CHECK failed: options->AppendPartialToString(&buf): ");
          pLVar9 = internal::LogMessage::operator<<
                             (pLVar9,"Protocol message could not be serialized.");
          internal::LogFinisher::operator=(&local_182,pLVar9);
        }
        if ((local_181 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_180);
        }
        local_1c1 = 0;
        bVar1 = MessageLite::ParsePartialFromString
                          (&original_options->super_MessageLite,(string *)local_148);
        if (!bVar1) {
          internal::LogMessage::LogMessage
                    (&local_1c0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1767);
          local_1c1 = 1;
          pLVar9 = internal::LogMessage::operator<<
                             (&local_1c0,"CHECK failed: options->ParsePartialFromString(buf): ");
          pLVar9 = internal::LogMessage::operator<<
                             (pLVar9,"Protocol message serialized itself in invalid fashion.");
          internal::LogFinisher::operator=(&local_1c2,pLVar9);
        }
        if ((local_1c1 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_1c0);
        }
        uVar4 = (*(original_options->super_MessageLite)._vptr_MessageLite[8])();
        pMVar7 = pMStack_28;
        if ((uVar4 & 1) == 0) {
          this_00 = this->builder_;
          element_name = (string *)(options + 4);
          (*(original_options->super_MessageLite)._vptr_MessageLite[9])(&local_208);
          std::operator+(&local_1e8,
                         "Options could not be fully parsed using the proto descriptors compiled into this binary. Missing required fields: "
                         ,&local_208);
          AddWarning(this_00,element_name,pMVar7,OTHER,&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_208);
        }
        std::__cxx11::string::~string((string *)local_148);
      }
      return (bool)((uninterpreted_options_field._7_1_ ^ 0xff) & 1);
    }
    iVar3 = (*(pMStack_28->super_MessageLite)._vptr_MessageLite[0x16])();
    pMVar7 = (Message *)
             (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x1a0))
                       ((long *)CONCAT44(extraout_var_01,iVar3),pMStack_28,local_b8,
                        buf.field_2._12_4_);
    pUVar8 = internal::
             down_cast<google::protobuf::UninterpretedOption_const*,google::protobuf::Message_const>
                       (pMVar7);
    this->uninterpreted_option_ = pUVar8;
    bVar1 = InterpretSingleOption(this,original_options);
    if (!bVar1) {
      uninterpreted_options_field._7_1_ = 1;
      goto LAB_00a83a09;
    }
    buf.field_2._12_4_ = buf.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretOptions(
    OptionsToInterpret* options_to_interpret) {
  // Note that these may be in different pools, so we can't use the same
  // descriptor and reflection objects on both.
  Message* options = options_to_interpret->options;
  const Message* original_options = options_to_interpret->original_options;

  bool failed = false;
  options_to_interpret_ = options_to_interpret;

  // Find the uninterpreted_option field in the mutable copy of the options
  // and clear them, since we're about to interpret them.
  const FieldDescriptor* uninterpreted_options_field =
      options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(uninterpreted_options_field != NULL)
      << "No field named \"uninterpreted_option\" in the Options proto.";
  options->GetReflection()->ClearField(options, uninterpreted_options_field);

  // Find the uninterpreted_option field in the original options.
  const FieldDescriptor* original_uninterpreted_options_field =
      original_options->GetDescriptor()->
          FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(original_uninterpreted_options_field != NULL)
      << "No field named \"uninterpreted_option\" in the Options proto.";

  const int num_uninterpreted_options = original_options->GetReflection()->
      FieldSize(*original_options, original_uninterpreted_options_field);
  for (int i = 0; i < num_uninterpreted_options; ++i) {
    uninterpreted_option_ = down_cast<const UninterpretedOption*>(
        &original_options->GetReflection()->GetRepeatedMessage(
            *original_options, original_uninterpreted_options_field, i));
    if (!InterpretSingleOption(options)) {
      // Error already added by InterpretSingleOption().
      failed = true;
      break;
    }
  }
  // Reset these, so we don't have any dangling pointers.
  uninterpreted_option_ = NULL;
  options_to_interpret_ = NULL;

  if (!failed) {
    // InterpretSingleOption() added the interpreted options in the
    // UnknownFieldSet, in case the option isn't yet known to us.  Now we
    // serialize the options message and deserialize it back.  That way, any
    // option fields that we do happen to know about will get moved from the
    // UnknownFieldSet into the real fields, and thus be available right away.
    // If they are not known, that's OK too. They will get reparsed into the
    // UnknownFieldSet and wait there until the message is parsed by something
    // that does know about the options.
    string buf;
    GOOGLE_CHECK(options->AppendPartialToString(&buf))
        << "Protocol message could not be serialized.";
    GOOGLE_CHECK(options->ParsePartialFromString(buf))
        << "Protocol message serialized itself in invalid fashion.";
    if (!options->IsInitialized()) {
      builder_->AddWarning(
          options_to_interpret->element_name, *original_options,
          DescriptorPool::ErrorCollector::OTHER,
          "Options could not be fully parsed using the proto descriptors "
          "compiled into this binary. Missing required fields: " +
          options->InitializationErrorString());
    }
  }
  return !failed;
}